

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
::difference_iterator
          (difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
           *this,_List_node_base *minuend_begin,_List_node_base *minuend_end,
          _List_node_base *subtrahend_begin,_List_node_base *subtrahend_end)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->m_minuend_begin)._M_node = minuend_begin;
  (this->m_minuend_end)._M_node = minuend_end;
  (this->m_subtrahend_begin)._M_node = subtrahend_begin;
  (this->m_subtrahend_end)._M_node = subtrahend_end;
  p_Var2 = minuend_begin;
  if (minuend_begin != minuend_end) {
    do {
      minuend_begin = p_Var2->_M_next;
      if (minuend_begin == minuend_end) goto LAB_00201f1c;
      p_Var1 = p_Var2 + 1;
      p_Var2 = minuend_begin;
    } while (*(char *)&minuend_begin[1]._M_next <= *(char *)&p_Var1->_M_next);
  }
  if (minuend_begin != minuend_end) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<std::_List_const_iterator<char>, std::_List_const_iterator<char>, std::greater<void>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<char>, ForwardIterator2 = std::_List_const_iterator<char>, Compare = std::greater<void>]"
                 );
  }
LAB_00201f1c:
  p_Var2 = subtrahend_begin;
  if (subtrahend_begin != subtrahend_end) {
    do {
      subtrahend_begin = p_Var2->_M_next;
      if (subtrahend_begin == subtrahend_end) goto LAB_00201f3e;
      p_Var1 = p_Var2 + 1;
      p_Var2 = subtrahend_begin;
    } while (*(char *)&subtrahend_begin[1]._M_next <= *(char *)&p_Var1->_M_next);
  }
  if (subtrahend_begin != subtrahend_end) {
    __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6c,
                  "burst::difference_iterator<std::_List_const_iterator<char>, std::_List_const_iterator<char>, std::greater<void>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<char>, ForwardIterator2 = std::_List_const_iterator<char>, Compare = std::greater<void>]"
                 );
  }
LAB_00201f3e:
  maintain_invariant(this);
  return;
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }